

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O3

String * __thiscall
Rml::Property::ToString_abi_cxx11_(String *__return_storage_ptr__,Property *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  PropertyDefinition *this_00;
  undefined8 *puVar4;
  undefined8 uVar5;
  String result;
  String local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  this_00 = this->definition;
  if (this_00 != (PropertyDefinition *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    PropertyDefinition::GetValue(this_00,__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity._0_4_ =
       local_90.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  Variant::
  GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&this->value,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    local_60._8_4_ = local_90.field_2._8_4_;
    local_60._12_4_ = local_90.field_2._12_4_;
    local_70 = &local_60;
  }
  else {
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_90._M_dataplus._M_p;
  }
  local_60._M_allocated_capacity._4_4_ = local_90.field_2._M_allocated_capacity._4_4_;
  local_60._M_allocated_capacity._0_4_ = local_90.field_2._M_allocated_capacity._0_4_;
  local_68 = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity._0_4_ =
       local_90.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_48 = 0;
  local_40 = 0;
  paVar3 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  local_50 = &local_40;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,&local_40,&local_40);
  TypeConverter<Rml::Unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Convert(&this->unit,&local_b0);
  uVar5 = 0xf;
  if (local_70 != &local_60) {
    uVar5 = local_60._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_b0._M_string_length + local_68) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      uVar5 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_68 <= (ulong)uVar5) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
      goto LAB_0024af84;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0._M_dataplus._M_p);
LAB_0024af84:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar5 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT44(local_90.field_2._M_allocated_capacity._4_4_,
                             local_90.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String Property::ToString() const
{
	if (!definition)
		return value.Get<String>() + Rml::ToString(unit);

	String string;
	definition->GetValue(string, *this);
	return string;
}